

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O0

void __thiscall
pstore::romfs::romfs::romfs(romfs *this,not_null<const_pstore::romfs::directory_*> root)

{
  bool bVar1;
  romfs *this_local;
  not_null<const_pstore::romfs::directory_*> root_local;
  
  (this->root_).ptr_ = root.ptr_;
  (this->cwd_).ptr_ = root.ptr_;
  bVar1 = fsck(this);
  if (!bVar1) {
    assert_failed("this->fsck ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/romfs/romfs.cpp"
                  ,0xf6);
  }
  return;
}

Assistant:

romfs::romfs (not_null<directory const *> const root)
                : root_{root}
                , cwd_{root} {
            PSTORE_ASSERT (this->fsck ());
        }